

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void xmlSBufCleanup(xmlSBuf *buf,xmlParserCtxtPtr ctxt,char *errMsg)

{
  if (buf->code != XML_ERR_OK) {
    xmlSBufReportError(buf,ctxt,errMsg);
  }
  (*xmlFree)(buf->mem);
  return;
}

Assistant:

static void
xmlSBufCleanup(xmlSBuf *buf, xmlParserCtxtPtr ctxt, const char *errMsg) {
    if (buf->code != XML_ERR_OK)
        xmlSBufReportError(buf, ctxt, errMsg);

    xmlFree(buf->mem);
}